

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GestDsk.cpp
# Opt level: O2

string * __thiscall DSK::ReadDskDir_abi_cxx11_(string *__return_storage_ptr__,DSK *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  char cVar4;
  int j;
  long lVar5;
  char cVar6;
  StDirEntry *pSVar7;
  int i;
  long lVar8;
  char Nom [13];
  string local_9d0 [32];
  ostringstream c;
  StDirEntry TabDir [64];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pSVar7 = TabDir;
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
    GetInfoDirEntry(this,(int)lVar8);
    pSVar7->User = GetInfoDirEntry::Dir.User;
    pSVar7->Nom[0] = GetInfoDirEntry::Dir.Nom[0];
    pSVar7->Nom[1] = GetInfoDirEntry::Dir.Nom[1];
    pSVar7->Nom[2] = GetInfoDirEntry::Dir.Nom[2];
    pSVar7->Nom[3] = GetInfoDirEntry::Dir.Nom[3];
    pSVar7->Nom[4] = GetInfoDirEntry::Dir.Nom[4];
    pSVar7->Nom[5] = GetInfoDirEntry::Dir.Nom[5];
    pSVar7->Nom[6] = GetInfoDirEntry::Dir.Nom[6];
    *(undefined8 *)(pSVar7->Nom + 7) = GetInfoDirEntry::Dir._8_8_;
    *(undefined8 *)pSVar7->Blocks = GetInfoDirEntry::Dir.Blocks._0_8_;
    *(undefined8 *)(pSVar7->Blocks + 8) = GetInfoDirEntry::Dir.Blocks._8_8_;
    pSVar7 = pSVar7 + 1;
  }
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
    bVar1 = TabDir[lVar8].User;
    if ((bVar1 != 0xe5) && (TabDir[lVar8].NumPage == '\0')) {
      Nom._0_8_ = *(undefined8 *)TabDir[lVar8].Nom;
      Nom[0xb] = TabDir[lVar8].Ext[2];
      Nom._9_2_ = *(undefined2 *)TabDir[lVar8].Ext;
      Nom[8] = '.';
      Nom[0xc] = '\0';
      for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
        bVar2 = Nom[lVar5];
        cVar6 = (char)(bVar2 & 0x7f);
        Nom[lVar5] = cVar6;
        iVar3 = isprint(bVar2 & 0x7f);
        cVar4 = '?';
        if (iVar3 != 0) {
          cVar4 = cVar6;
        }
        Nom[lVar5] = cVar4;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
      std::ostream::operator<<((ostream *)&c,(uint)bVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string(local_9d0);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DSK::ReadDskDir( void ) {
	StDirEntry TabDir[ 64 ];
	string catalogue;
	for ( int i = 0; i < 64; i++ ) {
		memcpy( &TabDir[ i ]
				, GetInfoDirEntry( i )
				, sizeof( StDirEntry )
			  );
	}
	// Trier les fichiers
	for ( int i = 0; i < 64; i++ ) {
		//
		// Afficher les fichiers non effac�s
		//
		if ( TabDir[ i ].User != USER_DELETED && ! TabDir[ i ].NumPage ) {
			char Nom[ 13 ];
			memcpy( Nom, TabDir[ i ].Nom, 8 );
			memcpy( &Nom[ 9 ], TabDir[ i ].Ext, 3 );
			Nom[ 8 ] = '.';
			Nom[ 12 ] = 0;
			//
			// Masquer les bits d'attributs
			//
			for ( int j = 0; j < 12; j++ )
			{
				Nom[ j ] &= 0x7F;

				if ( ! isprint( Nom[ j ] ) ) 
					Nom[ j ] = '?' ;
			}

			catalogue += Nom;
			catalogue += " "; 
			ostringstream c;
			c << (int)TabDir[i].User;
			catalogue += c.str();
			//
			// Calcule la taille du fichier en fonction du nombre de blocs
			//
			int p = 0, t = 0;
			do {
				if ( TabDir[ p + i ].User == TabDir[ i ].User )
					t += TabDir[ p + i ].NbPages;
				p++;
			} while( TabDir[ p + i ].NumPage && ( p + i ) < 64  );
            //string size = GetTaille( ( t + 7 ) >> 3  );
            //catalogue+= " : " + size + "\n";
            catalogue += "\n";

		}
	}
	return catalogue;
}